

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx::BVHNRefitter<8>::refit_toplevel
          (BBox3fa *__return_storage_ptr__,BVHNRefitter<8> *this,NodeRef *ref,size_t *subtrees,
          BBox3fa *subTreeBounds,size_t depth)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined8 uVar19;
  undefined1 auVar20 [32];
  AABBNode *node;
  long lVar21;
  BBox3fa bounds [8];
  undefined1 local_178 [16];
  undefined1 auStack_168 [16];
  undefined1 local_158 [16];
  undefined1 auStack_148 [16];
  undefined1 local_138 [16];
  undefined1 auStack_128 [16];
  undefined1 local_118 [16];
  undefined1 auStack_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  if (depth < 3) {
    uVar3 = ref->ptr;
    if ((uVar3 & 0xf) == 0) {
      lVar21 = 0;
      do {
        if (*(long *)(uVar3 + lVar21) == 8) {
          lVar1 = lVar21 * 4;
          *(undefined4 *)(local_178 + lVar1) = 0x7f800000;
          *(undefined4 *)(local_178 + lVar1 + 4) = 0x7f800000;
          *(undefined4 *)(local_178 + lVar1 + 8) = 0x7f800000;
          *(undefined4 *)(auStack_168 + lVar1 + -4) = 0x7f800000;
          lVar1 = lVar21 * 4;
          *(undefined4 *)(auStack_168 + lVar1) = 0xff800000;
          *(undefined4 *)(auStack_168 + lVar1 + 4) = 0xff800000;
          *(undefined4 *)(auStack_168 + lVar1 + 8) = 0xff800000;
          *(undefined4 *)(local_158 + lVar1 + -4) = 0xff800000;
        }
        else {
          refit_toplevel((BBox3fa *)&local_58.field_1,this,(NodeRef *)(uVar3 + lVar21),subtrees,
                         subTreeBounds,depth + 1);
          lVar1 = lVar21 * 4;
          *(undefined8 *)(local_178 + lVar1) = local_58._0_8_;
          *(undefined8 *)(local_178 + lVar1 + 8) = local_58._8_8_;
          *(undefined8 *)(auStack_168 + lVar1) = uStack_48;
          *(undefined8 *)(auStack_168 + lVar1 + 8) = uStack_40;
        }
        lVar21 = lVar21 + 8;
      } while (lVar21 != 0x40);
      auVar13._16_16_ = auStack_168;
      auVar13._0_16_ = local_178;
      auVar13 = vperm2f128_avx(ZEXT1632(local_f8),auVar13,2);
      auVar10._16_16_ = auStack_148;
      auVar10._0_16_ = local_158;
      auVar14 = vperm2f128_avx(ZEXT1632(local_d8),auVar10,2);
      auVar15._16_16_ = auStack_128;
      auVar15._0_16_ = local_138;
      auVar15 = vperm2f128_avx(ZEXT1632(local_b8),auVar15,2);
      auVar16._16_16_ = auStack_108;
      auVar16._0_16_ = local_118;
      auVar16 = vperm2f128_avx(ZEXT1632(local_98),auVar16,2);
      auVar10 = vunpcklps_avx(auVar13,auVar15);
      auVar13 = vunpckhps_avx(auVar13,auVar15);
      auVar15 = vunpcklps_avx(auVar14,auVar16);
      auVar14 = vunpckhps_avx(auVar14,auVar16);
      auVar16 = vunpcklps_avx(auVar13,auVar14);
      auVar14._16_16_ = local_158;
      auVar14._0_16_ = auStack_168;
      auVar14 = vperm2f128_avx(ZEXT1632(local_e8),auVar14,2);
      auVar11 = vunpcklps_avx(auVar10,auVar15);
      auVar12._16_16_ = local_138;
      auVar12._0_16_ = auStack_148;
      auVar17 = vperm2f128_avx(ZEXT1632(local_c8),auVar12,2);
      auVar13 = vunpckhps_avx(auVar10,auVar15);
      auVar18._16_16_ = local_118;
      auVar18._0_16_ = auStack_128;
      auVar10 = vperm2f128_avx(ZEXT1632(local_a8),auVar18,2);
      auVar20._16_16_ = local_f8;
      auVar20._0_16_ = auStack_108;
      auVar18 = vperm2f128_avx(ZEXT1632(local_88),auVar20,2);
      auVar15 = vunpcklps_avx(auVar14,auVar10);
      auVar14 = vunpckhps_avx(auVar14,auVar10);
      auVar12 = vunpcklps_avx(auVar17,auVar18);
      auVar10 = vunpckhps_avx(auVar17,auVar18);
      auVar10 = vunpcklps_avx(auVar14,auVar10);
      auVar17 = vunpcklps_avx(auVar15,auVar12);
      auVar14 = vunpckhps_avx(auVar15,auVar12);
      auVar5 = vminps_avx(local_178,local_158);
      auVar6 = vminps_avx(local_138,local_118);
      auVar7 = vminps_avx(auVar5,auVar6);
      auVar5 = vmaxps_avx(auStack_168,auStack_148);
      auVar6 = vmaxps_avx(auStack_128,auStack_108);
      auVar5 = vmaxps_avx(auVar5,auVar6);
      *(undefined1 (*) [32])(uVar3 + 0x40) = auVar11;
      *(undefined1 (*) [32])(uVar3 + 0x80) = auVar13;
      local_78 = auVar16._0_8_;
      uStack_70 = auVar16._8_8_;
      uStack_68 = auVar16._16_8_;
      uStack_60 = auVar16._24_8_;
      *(undefined8 *)(uVar3 + 0xc0) = local_78;
      *(undefined8 *)(uVar3 + 200) = uStack_70;
      *(undefined8 *)(uVar3 + 0xd0) = uStack_68;
      *(undefined8 *)(uVar3 + 0xd8) = uStack_60;
      *(undefined1 (*) [32])(uVar3 + 0x60) = auVar17;
      *(undefined1 (*) [32])(uVar3 + 0xa0) = auVar14;
      *(undefined1 (*) [32])(uVar3 + 0xe0) = auVar10;
      auVar6 = vminps_avx(local_f8,local_d8);
      auVar8 = vminps_avx(local_b8,local_98);
      auVar6 = vminps_avx(auVar6,auVar8);
      aVar9 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vminps_avx(auVar7,auVar6);
      auVar6 = vmaxps_avx(local_e8,local_c8);
      auVar7 = vmaxps_avx(local_a8,local_88);
      auVar6 = vmaxps_avx(auVar6,auVar7);
      aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vmaxps_avx(auVar5,auVar6);
      (__return_storage_ptr__->lower).field_0 = aVar9;
      (__return_storage_ptr__->upper).field_0 = aVar4;
    }
    else {
      (**this->leafBounds->_vptr_LeafBoundsInterface)(__return_storage_ptr__);
    }
  }
  else {
    sVar2 = *subtrees;
    *subtrees = sVar2 + 1;
    uVar19 = *(undefined8 *)((long)&subTreeBounds[sVar2].lower.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->lower).field_0 =
         *(undefined8 *)&subTreeBounds[sVar2].lower.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = uVar19;
    uVar19 = *(undefined8 *)((long)&subTreeBounds[sVar2].upper.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->upper).field_0 =
         *(undefined8 *)&subTreeBounds[sVar2].upper.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = uVar19;
  }
  return __return_storage_ptr__;
}

Assistant:

BBox3fa BVHNRefitter<N>::refit_toplevel(NodeRef& ref,
                                            size_t &subtrees,
                                            const BBox3fa *const subTreeBounds,
                                            const size_t depth)
    {
      if (depth >= MAX_SUB_TREE_EXTRACTION_DEPTH) 
      {
        assert(subtrees < MAX_NUM_SUB_TREES);
        assert(subTrees[subtrees] == ref);
        return subTreeBounds[subtrees++];
      }

      if (ref.isAABBNode())
      {
        AABBNode* node = ref.getAABBNode();
        BBox3fa bounds[N];

        for (size_t i=0; i<N; i++)
        {
          NodeRef& child = node->child(i);

          if (unlikely(child == BVH::emptyNode)) 
            bounds[i] = BBox3fa(empty);
          else
            bounds[i] = refit_toplevel(child,subtrees,subTreeBounds,depth+1); 
        }
        
        BBox3vf<N> boundsT = transpose<N>(bounds);
      
        /* set new bounds */
        node->lower_x = boundsT.lower.x;
        node->lower_y = boundsT.lower.y;
        node->lower_z = boundsT.lower.z;
        node->upper_x = boundsT.upper.x;
        node->upper_y = boundsT.upper.y;
        node->upper_z = boundsT.upper.z;
        
        return merge<N>(bounds);
      }
      else
        return leafBounds.leafBounds(ref);
    }